

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ExprAttachSubtrees(sqlite3 *db,Expr *pRoot,Expr *pLeft,Expr *pRight)

{
  Expr *pRight_local;
  Expr *pLeft_local;
  Expr *pRoot_local;
  sqlite3 *db_local;
  
  if (pRoot == (Expr *)0x0) {
    sqlite3ExprDelete(db,pLeft);
    sqlite3ExprDelete(db,pRight);
  }
  else {
    if (pRight != (Expr *)0x0) {
      pRoot->pRight = pRight;
      pRoot->flags = pRight->flags & 0x400208 | pRoot->flags;
    }
    if (pLeft != (Expr *)0x0) {
      pRoot->pLeft = pLeft;
      pRoot->flags = pLeft->flags & 0x400208 | pRoot->flags;
    }
    exprSetHeight(pRoot);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprAttachSubtrees(
  sqlite3 *db,
  Expr *pRoot,
  Expr *pLeft,
  Expr *pRight
){
  if( pRoot==0 ){
    assert( db->mallocFailed );
    sqlite3ExprDelete(db, pLeft);
    sqlite3ExprDelete(db, pRight);
  }else{
    if( pRight ){
      pRoot->pRight = pRight;
      pRoot->flags |= EP_Propagate & pRight->flags;
    }
    if( pLeft ){
      pRoot->pLeft = pLeft;
      pRoot->flags |= EP_Propagate & pLeft->flags;
    }
    exprSetHeight(pRoot);
  }
}